

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O3

void __thiscall
fileStoreFixture::fileStoreFixture(fileStoreFixture *this,bool resetBefore,bool reset)

{
  MessageStore *pMVar1;
  SessionID sessionID;
  long *local_348;
  long local_340;
  long local_338 [2];
  long *local_328;
  long local_320;
  long local_318 [2];
  long *local_308;
  long local_300;
  long local_2f8 [2];
  string local_2e8;
  string local_2c8;
  string local_2a8;
  FieldBase local_288;
  undefined1 local_230 [176];
  undefined1 local_180 [88];
  FieldBase local_128;
  FieldBase local_d0;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_180._0_8_ = local_180 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"store","");
  FIX::FileStoreFactory::FileStoreFactory(&this->factory,(string *)local_180);
  if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if (resetBefore) {
    local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"SETGET","");
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"TEST","");
    FIX::deleteSession(&local_2a8,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
  }
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"FIX.4.2","");
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00320f80;
  local_288.m_tag = 8;
  local_288.m_string._M_dataplus._M_p = (pointer)&local_288.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288.m_string,local_328,local_320 + (long)local_328);
  local_288.m_data._M_dataplus._M_p = (pointer)&local_288.m_data.field_2;
  local_288.m_data._M_string_length = 0;
  local_288.m_data.field_2._M_local_buf[0] = '\0';
  local_288.m_metrics.m_length = 0;
  local_288.m_metrics.m_checksum = 0;
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325970;
  local_348 = local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"SETGET","");
  local_230._0_8_ = &PTR__FieldBase_00320f80;
  local_230._8_4_ = 0x31;
  local_230._16_8_ = local_230 + 0x20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_230 + 0x10),local_348,local_340 + (long)local_348);
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_230._80_4_ = 0;
  local_230._84_4_ = 0;
  local_230._0_8_ = &PTR__FieldBase_00325010;
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"TEST","");
  local_230._88_8_ = &PTR__FieldBase_00320f80;
  local_230._96_4_ = 0x38;
  local_230._104_8_ = local_230 + 0x78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_230 + 0x68),local_308,local_300 + (long)local_308);
  local_230._136_8_ = local_230 + 0x98;
  local_230._144_8_ = 0;
  local_230[0x98] = '\0';
  local_230._168_4_ = 0;
  local_230._172_4_ = 0;
  local_230._88_8_ = &PTR__FieldBase_00325400;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"");
  FIX::SessionID::SessionID
            ((SessionID *)local_180,&local_288.m_string,(string *)(local_230 + 0x10),
             (string *)(local_230 + 0x68),&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)(local_230 + 0x58));
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_230);
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_288);
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  FIX::DateTime::nowUtc();
  local_230._12_4_ = local_288._12_4_;
  local_230._8_4_ = local_288.m_tag;
  local_230._16_8_ = local_288.m_string._M_dataplus._M_p;
  local_230._0_8_ = &PTR__DateTime_003254a8;
  pMVar1 = (MessageStore *)
           FIX::FileStoreFactory::create((UtcTimeStamp *)this,(SessionID *)local_230);
  this->object = pMVar1;
  this->resetAfter = reset;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_d0);
  FIX::FieldBase::~FieldBase(&local_128);
  FIX::FieldBase::~FieldBase((FieldBase *)local_180);
  return;
}

Assistant:

fileStoreFixture(bool resetBefore, bool reset)
      : factory("store") {
    if (resetBefore) {
      deleteSession("SETGET", "TEST");
    }

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    object = factory.create(UtcTimeStamp::now(), sessionID);

    this->resetAfter = reset;
  }